

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

int telnet_vprintf(telnet_t *telnet,char *fmt,__va_list_tag *va)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  ulong uVar6;
  int in_R8D;
  va_list va_temp;
  char buffer [1024];
  char local_482 [2];
  telnet_event_t local_480;
  undefined8 local_458;
  void *pvStack_450;
  void *local_448;
  char local_438 [1032];
  
  local_458._0_4_ = va->gp_offset;
  local_458._4_4_ = va->fp_offset;
  pvStack_450 = va->overflow_arg_area;
  local_448 = va->reg_save_area;
  pcVar4 = local_438;
  uVar2 = vsnprintf(pcVar4,0x400,fmt,&local_458);
  if (0x3ff < uVar2) {
    pcVar4 = (char *)malloc((ulong)(uVar2 + 1));
    if (pcVar4 == (char *)0x0) {
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      _error(telnet,0x5c8,"telnet_vprintf",TELNET_ENOMEM,in_R8D,"malloc() failed: %s",pcVar4);
      return -1;
    }
    local_448 = va->reg_save_area;
    local_458._0_4_ = va->gp_offset;
    local_458._4_4_ = va->fp_offset;
    pvStack_450 = va->overflow_arg_area;
    uVar2 = vsnprintf(pcVar4,(ulong)(uVar2 + 1),fmt,&local_458);
  }
  if (uVar2 != 0) {
    uVar6 = 0;
    uVar3 = 0;
    do {
      cVar1 = pcVar4[uVar6];
      if (((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == -1)) {
        if (uVar6 != uVar3) {
          local_480.data.buffer = pcVar4 + uVar3;
          local_480.data.size = (size_t)((int)uVar6 - uVar3);
          local_480.type = TELNET_EV_SEND;
          (*telnet->eh)(telnet,&local_480,telnet->ud);
          cVar1 = pcVar4[uVar6];
        }
        uVar3 = (int)uVar6 + 1;
        if (cVar1 == '\n') {
          local_480.data.buffer = "\r\n";
        }
        else if (cVar1 == '\r') {
          local_480.data.buffer = "\r";
        }
        else {
          if (cVar1 != -1) goto LAB_001033a4;
          local_482[0] = -1;
          local_482[1] = -1;
          local_480.data.buffer = local_482;
        }
        local_480.type = TELNET_EV_SEND;
        local_480.data.size = 2;
        (*telnet->eh)(telnet,&local_480,telnet->ud);
      }
LAB_001033a4:
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
    if (uVar2 - uVar3 != 0) {
      local_480.data.buffer = pcVar4 + uVar3;
      local_480.type = TELNET_EV_SEND;
      local_480.data.size = (ulong)(uVar2 - uVar3);
      (*telnet->eh)(telnet,&local_480,telnet->ud);
    }
  }
  if (pcVar4 != local_438) {
    free(pcVar4);
  }
  return uVar2;
}

Assistant:

int telnet_vprintf(telnet_t *telnet, const char *fmt, va_list va) {
	va_list va_temp;
	char buffer[1024];
	char *output = buffer;
	unsigned int rs, i, l;

	/* format */
	va_copy(va_temp, va);
	rs = vsnprintf(buffer, sizeof(buffer), fmt, va_temp);
	va_end(va_temp);

	if (rs >= sizeof(buffer)) {
		output = (char*)malloc(rs + 1);
		if (output == 0) {
			_error(telnet, __LINE__, __func__, TELNET_ENOMEM, 0,
					"malloc() failed: %s", strerror(errno));
			return -1;
		}

		va_copy(va_temp, va);
		rs = vsnprintf(output, rs + 1, fmt, va_temp);
		va_end(va_temp);
	}

	/* send */
	for (l = i = 0; i != rs; ++i) {
		/* special characters */
		if (output[i] == (char)TELNET_IAC || output[i] == '\r' ||
				output[i] == '\n') {
			/* dump prior portion of text */
			if (i != l)
				_send(telnet, output + l, i - l);
			l = i + 1;

			/* IAC -> IAC IAC */
			if (output[i] == (char)TELNET_IAC)
				telnet_iac(telnet, TELNET_IAC);
			/* automatic translation of \r -> CRNUL */
			else if (output[i] == '\r')
				_send(telnet, CRNUL, 2);
			/* automatic translation of \n -> CRLF */
			else if (output[i] == '\n')
				_send(telnet, CRLF, 2);
		}
	}

	/* send whatever portion of output is left */
	if (i != l) {
		_send(telnet, output + l, i - l);
	}

	/* free allocated memory, if any */
	if (output != buffer) {
		free(output);
	}

	return rs;
}